

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall
cs_impl::any::
make<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
          (any *this,deque<cs_impl::any,_std::allocator<cs_impl::any>_> *args)

{
  baseHolder *pbVar1;
  proxy *ppVar2;
  
  if ((DAT_00337fa0 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x58);
  }
  else {
    pbVar1 = *(baseHolder **)
              (&holder<cs_impl::fiber::Channel<cs_impl::any>>::allocator + DAT_00337fa0 * 8);
    DAT_00337fa0 = DAT_00337fa0 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__holder_00328600;
  std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base
            ((_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)(pbVar1 + 1),
             &args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>);
  if ((DAT_00339e90 == 0) || (cs::global_thread_counter != 0)) {
    ppVar2 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar2 = (proxy *)(&cs::null_pointer)[DAT_00339e90];
    DAT_00339e90 = DAT_00339e90 + -1;
  }
  ppVar2->is_rvalue = false;
  ppVar2->protect_level = 0;
  ppVar2->refcount = 1;
  ppVar2->data = pbVar1;
  this->mDat = ppVar2;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}